

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-profile.c
# Opt level: O0

int lstop(lua_State *L)

{
  lua_Number lVar1;
  double dVar2;
  double total_time;
  double ti;
  lua_State *L_local;
  
  lua_pushthread(L);
  lua_rawget(L,-0xf4629);
  luaL_checktype(L,-1,3);
  lVar1 = lua_tonumberx(L,-1,(int *)0x0);
  dVar2 = diff_time(lVar1);
  lua_pushthread(L);
  lua_rawget(L,-0xf462a);
  lVar1 = lua_tonumberx(L,-1,(int *)0x0);
  lua_pushthread(L);
  lua_pushnil(L);
  lua_rawset(L,-0xf4629);
  lua_pushthread(L);
  lua_pushnil(L);
  lua_rawset(L,-0xf462a);
  lua_pushnumber(L,dVar2 + lVar1);
  return 1;
}

Assistant:

static int
lstop(lua_State *L) {
	lua_pushthread(L);
	lua_rawget(L, lua_upvalueindex(1));
	luaL_checktype(L, -1, LUA_TNUMBER);
	double ti = diff_time(lua_tonumber(L, -1));
	lua_pushthread(L);
	lua_rawget(L, lua_upvalueindex(2));
	double total_time = lua_tonumber(L, -1);

	lua_pushthread(L);
	lua_pushnil(L);
	lua_rawset(L, lua_upvalueindex(1));

	lua_pushthread(L);
	lua_pushnil(L);
	lua_rawset(L, lua_upvalueindex(2));

	lua_pushnumber(L, ti + total_time);

	return 1;
}